

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall
Potassco::SmodelsInput::SymTab::add(SymTab *this,Atom_t id,StringSpan *name,bool output)

{
  byte in_CL;
  Span<char> *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar1;
  Lit_t lit;
  uint *in_stack_ffffffffffffff10;
  long *plVar2;
  value_type *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char *in_stack_ffffffffffffff28;
  Span<int> local_a8;
  int local_94;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_90;
  undefined1 local_88;
  allocator<char> local_69;
  string local_68 [79];
  byte local_19;
  Span<char> *local_18;
  int local_c;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_c = in_ESI;
  begin<char>(in_RDX);
  end<char>((Span<char> *)0x13d09e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            (in_RDI,in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (allocator<char> *)in_stack_ffffffffffffff18);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             &in_stack_ffffffffffffff18->first,in_stack_ffffffffffffff10);
  pVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
  local_90._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
       ._M_cur;
  local_88 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)0x13d12e);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if ((local_19 & 1) != 0) {
    local_94 = local_c;
    plVar2 = *(long **)(in_RDI + 3);
    local_a8 = toSpan<int>(&local_94,1);
    (**(code **)(*plVar2 + 0x40))(plVar2,local_18,&local_a8);
  }
  return;
}

Assistant:

virtual void add(Atom_t id, const StringSpan& name, bool output) {
		atoms.insert(StrMap::value_type(std::string(Potassco::begin(name), Potassco::end(name)), id));
		if (output) {
			Lit_t lit = static_cast<Lit_t>(id);
			out->output(name, toSpan(&lit, 1));
		}
	}